

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::MapFieldStateTest_MergeFromRepeatedDirty_Test::
~MapFieldStateTest_MergeFromRepeatedDirty_Test(MapFieldStateTest_MergeFromRepeatedDirty_Test *this)

{
  (this->super_MapFieldStateTest).
  super_TestWithParam<std::tuple<google::protobuf::internal::(anonymous_namespace)::State,_bool>_>.
  super_Test._vptr_Test = (_func_int **)&PTR__MapFieldStateTest_0189db60;
  (this->super_MapFieldStateTest).
  super_TestWithParam<std::tuple<google::protobuf::internal::(anonymous_namespace)::State,_bool>_>.
  super_WithParamInterface<std::tuple<google::protobuf::internal::(anonymous_namespace)::State,_bool>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__MapFieldStateTest_0189dba0;
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  ::~ArenaHolder(&(this->super_MapFieldStateTest).map_field_);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr(&(this->super_MapFieldStateTest).arena_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_P(MapFieldStateTest, MergeFromRepeatedDirty) {
  ArenaHolder<MapFieldType> other(arena_.get());
  MakeRepeatedDirty(other.get());

  map_field_->MergeFrom(*other);

  if (state_ != MAP_DIRTY) {
    Expect(map_field_.get(), MAP_DIRTY, 1, 1);
  } else {
    Expect(map_field_.get(), MAP_DIRTY, 1, 0);
  }

  Expect(other.get(), CLEAN, 1, 1);
}